

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_to_uint32_array(void *vout,run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  if (0 < cont->n_runs) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      uVar1 = cont->runs[lVar3].length;
      iVar2 = (int)lVar4;
      lVar4 = (long)iVar2;
      iVar6 = cont->runs[lVar3].value + base;
      uVar5 = 0;
      do {
        *(int *)((long)vout + lVar4 * 4) = iVar6;
        lVar4 = lVar4 + 1;
        uVar5 = uVar5 - 1;
        iVar6 = iVar6 + 1;
      } while (~(uint)uVar1 != uVar5);
      lVar3 = lVar3 + 1;
    } while (lVar3 < cont->n_runs);
    return iVar2 - uVar5;
  }
  return 0;
}

Assistant:

int run_container_to_uint32_array(void *vout, const run_container_t *cont,
                                  uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (int j = 0; j <= le; ++j) {
            uint32_t val = run_start + j;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
        }
    }
    return outpos;
}